

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * flatbuffers::BaseGenerator::NamespaceDir
                   (string *__return_storage_ptr__,Parser *parser,string *path,Namespace *ns,
                   bool dasherize)

{
  bool bVar1;
  pointer input;
  string local_50;
  
  EnsureDirExists(path);
  bVar1 = (parser->opts).one_file;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  if (bVar1 == false) {
    for (input = (ns->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        input != (ns->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; input = input + 1) {
      if (dasherize) {
        ConvertCase(&local_50,input,kDasher,kUpperCamel);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,(string *)input);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      EnsureDirExists(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::NamespaceDir(const Parser &parser,
                                        const std::string &path,
                                        const Namespace &ns,
                                        const bool dasherize) {
  EnsureDirExists(path);
  if (parser.opts.one_file) return path;
  std::string namespace_dir = path;  // Either empty or ends in separator.
  auto &namespaces = ns.components;
  for (auto it = namespaces.begin(); it != namespaces.end(); ++it) {
    namespace_dir +=
        !dasherize ? *it : ConvertCase(*it, Case::kDasher, Case::kUpperCamel);
    namespace_dir += kPathSeparator;
    EnsureDirExists(namespace_dir);
  }
  return namespace_dir;
}